

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

string * cmExtraEclipseCDT4Generator::EscapeForXML(string *__return_storage_ptr__,string *value)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"&","&amp;");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"<","&lt;");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,">","&gt;");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"\"","&quot;");
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraEclipseCDT4Generator::EscapeForXML(const std::string& value)
{
  std::string str = value;
  cmSystemTools::ReplaceString(str, "&", "&amp;");
  cmSystemTools::ReplaceString(str, "<", "&lt;");
  cmSystemTools::ReplaceString(str, ">", "&gt;");
  cmSystemTools::ReplaceString(str, "\"", "&quot;");
  // NOTE: This one is not necessary, since as of Eclipse CDT4 it will
  //       automatically change this to the original value (').
  //cmSystemTools::ReplaceString(str, "'", "&apos;");
  return str;
}